

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensusProblem.hpp
# Opt level: O0

void __thiscall
opengv::sac::SampleConsensusProblem<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::SampleConsensusProblem
          (SampleConsensusProblem<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this,bool randomSeed)

{
  _Bind<std::uniform_int_distribution<int>_(std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>)>
  *__f;
  byte in_SIL;
  undefined8 *in_RDI;
  int in_stack_ffffffffffffebf8;
  int in_stack_ffffffffffffebfc;
  uniform_int_distribution<int> *in_stack_ffffffffffffec00;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *__args;
  uniform_int_distribution<int> *in_stack_ffffffffffffec08;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffec10;
  
  *in_RDI = &PTR__SampleConsensusProblem_0144f7d0;
  *(undefined4 *)(in_RDI + 1) = 10;
  std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::shared_ptr
            ((shared_ptr<std::vector<int,_std::allocator<int>_>_> *)0xb8d7bb);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xb8d7ce);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0xb8d7dc);
  std::shared_ptr<std::uniform_int_distribution<int>_>::shared_ptr
            ((shared_ptr<std::uniform_int_distribution<int>_> *)0xb8d7fc);
  std::shared_ptr<std::function<int_()>_>::shared_ptr
            ((shared_ptr<std::function<int_()>_> *)0xb8d812);
  operator_new(8);
  std::numeric_limits<int>::max();
  std::uniform_int_distribution<int>::uniform_int_distribution
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8);
  std::__shared_ptr<std::uniform_int_distribution<int>,(__gnu_cxx::_Lock_policy)2>::
  reset<std::uniform_int_distribution<int>>
            ((__shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2> *)
             in_stack_ffffffffffffec10,in_stack_ffffffffffffec08);
  if ((in_SIL & 1) == 0) {
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(in_stack_ffffffffffffec10,(result_type_conflict)in_stack_ffffffffffffec08);
  }
  else {
    in_stack_ffffffffffffec10 =
         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)(in_RDI + 7);
    time((time_t *)0x0);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(in_stack_ffffffffffffec10,(result_type_conflict)in_stack_ffffffffffffec08);
  }
  __args = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)(in_RDI + 0x27a);
  __f = (_Bind<std::uniform_int_distribution<int>_(std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>)>
         *)operator_new(0x20);
  std::
  __shared_ptr_access<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__args);
  std::
  bind<std::uniform_int_distribution<int>&,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            (&__f->_M_f,__args);
  std::function<int()>::
  function<std::_Bind<std::uniform_int_distribution<int>(std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>)>,void>
            ((function<int_()> *)in_stack_ffffffffffffec10,__f);
  std::__shared_ptr<std::function<int()>,(__gnu_cxx::_Lock_policy)2>::reset<std::function<int()>>
            ((__shared_ptr<std::function<int_()>,_(__gnu_cxx::_Lock_policy)2> *)
             in_stack_ffffffffffffec10,(function<int_()> *)__f);
  return;
}

Assistant:

opengv::sac::SampleConsensusProblem<M>::SampleConsensusProblem(
    bool randomSeed) :
    max_sample_checks_(10)
{
  rng_dist_.reset(new std::uniform_int_distribution<>( 0, std::numeric_limits<int>::max() ));
  // Create a random number generator object
  if(randomSeed)
    rng_alg_.seed(static_cast<unsigned> (std::time(0)));
  else
    rng_alg_.seed(12345u);

  rng_gen_.reset(new std::function<int()>(std::bind(*rng_dist_, rng_alg_)));
}